

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *this,EVP_PKEY_CTX *ctx)

{
  pointer p;
  pointer p_00;
  pointer pSVar1;
  
  p_00 = this->data_;
  if (this->len != 0) {
    pSVar1 = p_00 + this->len;
    do {
      p = (p_00->super_SmallVectorBase<slang::ast::NetAlias>).data_;
      if (p != (pointer)(p_00->super_SmallVectorBase<slang::ast::NetAlias>).firstElement) {
        operator_delete(p);
      }
      p_00 = p_00 + 1;
    } while (p_00 != pSVar1);
    p_00 = this->data_;
  }
  if (p_00 != (pointer)this->firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }